

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O1

void __thiscall FileTest::Test4(FileTest *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  FileTest *pFVar4;
  int i;
  ulong uVar5;
  int j;
  ulong uVar6;
  Path p;
  File f;
  File f2;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 local_b0 [64];
  
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"tmp4","");
  JetHead::Path::touch();
  JetHead::File::File((File *)local_b0);
  pFVar4 = (FileTest *)local_b0;
  JetHead::File::open((Path *)pFVar4,(int)local_d0);
  fillFile(pFVar4,(File *)local_b0);
  JetHead::File::close();
  JetHead::File::open((Path *)local_b0,(int)local_d0);
  lVar2 = JetHead::File::mmap();
  if (lVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1c3,"Failed to map file");
  }
  lVar3 = JetHead::File::getLength();
  if (lVar3 != 0x600) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1c6,"file incorrect length");
  }
  uVar5 = 0;
  lVar3 = lVar2;
  do {
    if (uVar5 != *(byte *)(lVar2 + uVar5 * 0x100)) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
                 ,0x1cb,"Failed to validate file data with mmap");
    }
    uVar6 = 1;
    do {
      if (uVar6 != *(byte *)(lVar3 + uVar6)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
                   ,0x1d4,"Failed to validate file data with mmap");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x100);
    uVar5 = uVar5 + 1;
    lVar3 = lVar3 + 0x100;
  } while (uVar5 != 6);
  *(undefined1 *)(lVar2 + 100) = 5;
  JetHead::File::msync();
  JetHead::File::File((File *)&stack0xffffffffffffff90);
  pFVar4 = (FileTest *)&stack0xffffffffffffff90;
  JetHead::File::open((Path *)pFVar4,(int)local_d0);
  bVar1 = validateFile(pFVar4,(File *)&stack0xffffffffffffff90);
  if (bVar1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1e1,"mmap modified file not changed on disk");
  }
  JetHead::File::close();
  JetHead::File::munmap();
  JetHead::File::close();
  lVar2 = JetHead::File::mmap();
  if (lVar2 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1eb,"Calling mmap on closed file worked...");
  }
  JetHead::File::~File((File *)&stack0xffffffffffffff90);
  JetHead::File::~File((File *)local_b0);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  return;
}

Assistant:

void FileTest::Test4()
{
	Path p( "tmp4" );
	p.touch();
	File f;
	
	f.open( p, File::OF_WRITE );

	// fill the file with 1536 bytes of data.	
	fillFile( f );

	f.close();
	
	f.open( p, File::OF_RDWR );

	uint8_t *file_data = f.mmap();
	
	if ( file_data == NULL )
		TestFailed( "Failed to map file" );
		
	if ( f.getLength() != 1536 )
		TestFailed( "file incorrect length" );
		
	for ( int i = 0; i < 6; i++ )
	{
		if ( file_data[ i * 256 ] != i )
			TestFailed( "Failed to validate file data with mmap" );

		LOG_INFO( "byte one good" );
		
		for ( int j = 1; j < 256; j++ )
		{
			if ( file_data[ ( i * 256 ) + j ] != j )
			{
				LOG_INFO( "Failed at byte %d", j );
				TestFailed( "Failed to validate file data with mmap" );
			}
		}
	}
	
	file_data[ 100 ] = 5;
	
	f.msync();

	File f2;
	f2.open( p );
	
	if ( validateFile( f2 ) )
		TestFailed( "mmap modified file not changed on disk" );
	
	f2.close();
	
	f.munmap();
	f.close();

	file_data = f.mmap();
	
	if ( file_data != NULL )
		TestFailed( "Calling mmap on closed file worked..." );
}